

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_string_ptr(uchar *input,printbuffer *output_buffer)

{
  byte bVar1;
  byte *pbVar2;
  uchar *puVar3;
  ulong uVar4;
  size_t __n;
  long lVar5;
  byte *pbVar6;
  byte *__s;
  
  if (input == (uchar *)0x0) {
    puVar3 = ensure(output_buffer,3);
    if (puVar3 != (uchar *)0x0) {
      puVar3[2] = '\0';
      puVar3[0] = '\"';
      puVar3[1] = '\"';
      return 1;
    }
    return 0;
  }
  __n = 0;
  lVar5 = 0;
LAB_0010448a:
  bVar1 = input[__n];
  uVar4 = (ulong)bVar1;
  if (uVar4 < 0x23) {
    if ((0x400003700U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0) goto LAB_001044a8;
      pbVar2 = ensure(output_buffer,__n + lVar5 + 3);
      if (pbVar2 == (byte *)0x0) {
        return 0;
      }
      *pbVar2 = 0x22;
      pbVar6 = pbVar2;
      if (lVar5 == 0) {
        memcpy(pbVar2 + 1,input,__n);
      }
      else {
        for (; bVar1 = *input, bVar1 != 0; input = input + 1) {
          if (((bVar1 < 0x20) || (bVar1 == 0x22)) || (bVar1 == 0x5c)) {
            __s = pbVar6 + 2;
            pbVar6[1] = 0x5c;
            bVar1 = *input;
            switch(bVar1) {
            case 8:
              *__s = 0x62;
              break;
            case 9:
              *__s = 0x74;
              break;
            case 10:
              *__s = 0x6e;
              break;
            case 0xb:
switchD_00104522_caseD_b:
              sprintf((char *)__s,"u%04x");
              __s = pbVar6 + 6;
              break;
            case 0xc:
              *__s = 0x66;
              break;
            case 0xd:
              *__s = 0x72;
              break;
            default:
              if (bVar1 == 0x22) {
                *__s = 0x22;
              }
              else {
                if (bVar1 != 0x5c) goto switchD_00104522_caseD_b;
                *__s = 0x5c;
              }
            }
          }
          else {
            __s = pbVar6 + 1;
            *__s = bVar1;
          }
          pbVar6 = __s;
        }
      }
      (pbVar2 + __n + 1 + lVar5)[0] = 0x22;
      (pbVar2 + __n + 1 + lVar5)[1] = 0;
      return 1;
    }
LAB_0010449b:
    lVar5 = lVar5 + 1;
  }
  else {
LAB_001044a8:
    if (bVar1 == 0x5c) goto LAB_0010449b;
    if (bVar1 < 0x20) {
      lVar5 = lVar5 + 5;
    }
  }
  __n = __n + 1;
  goto LAB_0010448a;
}

Assistant:

static cJSON_bool print_string_ptr(const unsigned char * const input, printbuffer * const output_buffer)
{
    const unsigned char *input_pointer = NULL;
    unsigned char *output = NULL;
    unsigned char *output_pointer = NULL;
    size_t output_length = 0;
    /* numbers of additional characters needed for escaping */
    size_t escape_characters = 0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* empty string */
    if (input == NULL)
    {
        output = ensure(output_buffer, sizeof("\"\""));
        if (output == NULL)
        {
            return false;
        }
        strcpy((char*)output, "\"\"");

        return true;
    }

    /* set "flag" to 1 if something needs to be escaped */
    for (input_pointer = input; *input_pointer; input_pointer++)
    {
        switch (*input_pointer)
        {
            case '\"':
            case '\\':
            case '\b':
            case '\f':
            case '\n':
            case '\r':
            case '\t':
                /* one character escape sequence */
                escape_characters++;
                break;
            default:
                if (*input_pointer < 32)
                {
                    /* UTF-16 escape sequence uXXXX */
                    escape_characters += 5;
                }
                break;
        }
    }
    output_length = (size_t)(input_pointer - input) + escape_characters;

    output = ensure(output_buffer, output_length + sizeof("\"\""));
    if (output == NULL)
    {
        return false;
    }

    /* no characters have to be escaped */
    if (escape_characters == 0)
    {
        output[0] = '\"';
        memcpy(output + 1, input, output_length);
        output[output_length + 1] = '\"';
        output[output_length + 2] = '\0';

        return true;
    }

    output[0] = '\"';
    output_pointer = output + 1;
    /* copy the string */
    for (input_pointer = input; *input_pointer != '\0'; (void)input_pointer++, output_pointer++)
    {
        if ((*input_pointer > 31) && (*input_pointer != '\"') && (*input_pointer != '\\'))
        {
            /* normal character, copy */
            *output_pointer = *input_pointer;
        }
        else
        {
            /* character needs to be escaped */
            *output_pointer++ = '\\';
            switch (*input_pointer)
            {
                case '\\':
                    *output_pointer = '\\';
                    break;
                case '\"':
                    *output_pointer = '\"';
                    break;
                case '\b':
                    *output_pointer = 'b';
                    break;
                case '\f':
                    *output_pointer = 'f';
                    break;
                case '\n':
                    *output_pointer = 'n';
                    break;
                case '\r':
                    *output_pointer = 'r';
                    break;
                case '\t':
                    *output_pointer = 't';
                    break;
                default:
                    /* escape and print as unicode codepoint */
                    sprintf((char*)output_pointer, "u%04x", *input_pointer);
                    output_pointer += 4;
                    break;
            }
        }
    }
    output[output_length + 1] = '\"';
    output[output_length + 2] = '\0';

    return true;
}